

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

PromiseType __thiscall
QtPromise::attempt<tst_qpromise_each::delayedRejected()::__0_const&,int_const&,int&>
          (QtPromise *this,anon_class_1_0_00000001_for_fn *fn,int *args,int *args_1)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> extraout_RDX;
  PromiseType PVar1;
  anon_class_24_3_96d3e8cf local_40;
  int *local_28;
  int *args_local_1;
  int *args_local;
  anon_class_1_0_00000001_for_fn *fn_local;
  
  local_40.fn = fn;
  local_40.args = args;
  local_40.args = args_1;
  local_28 = args_1;
  args_local_1 = args;
  args_local = (int *)fn;
  fn_local = (anon_class_1_0_00000001_for_fn *)this;
  QPromise<int>::
  QPromise<QtPromise::attempt<tst_qpromise_each::delayedRejected()::__0_const&,int_const&,int&>(tst_qpromise_each::delayedRejected()::__0_const&,int_const&,int&)::_lambda(QtPromise::QPromiseResolve<int>&&,QtPromise::QPromiseReject<int>&&)_1_>
            ((QPromise<int> *)this,&local_40);
  PVar1.super_QPromiseBase<int>.m_d.d = extraout_RDX.d;
  PVar1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)this;
  return (PromiseType)PVar1.super_QPromiseBase<int>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseFunctor<Functor, Args...>::PromiseType
attempt(Functor&& fn, Args&&... args)
{
    using namespace QtPromisePrivate;
    using FunctorType = PromiseFunctor<Functor, Args...>;
    using PromiseType = typename FunctorType::PromiseType;
    using ValueType = typename PromiseType::Type;

    // NOTE: std::forward<T<U>>: MSVC 2013 fails when forwarding
    // template type (error: "expects 4 arguments - 0 provided").
    // However it succeeds with type alias.
    // TODO: should we expose QPromise::ResolveType & RejectType?
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseDispatch<typename FunctorType::ResultType>::call(std::forward<ResolveType>(resolve),
                                                                std::forward<RejectType>(reject),
                                                                std::forward<Functor>(fn),
                                                                std::forward<Args>(args)...);
    }};
}